

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixFileSystem.cpp
# Opt level: O2

FileIterator __thiscall fs::FolderDescriptor::Impl::next(Impl *this)

{
  dirent *pdVar1;
  FileIterator it;
  FileIterator local_10;
  
  if (this->_dir == (Folder)0x0) {
    FileIterator::FileIterator(&local_10,(File)0x0);
  }
  else {
    FileIterator::FileIterator(&local_10,this->_file);
    pdVar1 = readdir((DIR *)this->_dir);
    this->_file = (File)pdVar1;
  }
  return (FileIterator)local_10._filedesc;
}

Assistant:

bool FolderDescriptor::Impl::validDir() const noexcept
  {
	  return _dir != InvalidFolder;
  }